

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

bool glu::sl::isValid(ShaderCaseSpecification *spec)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  char *pcVar11;
  bool bVar12;
  byte local_45;
  bool hasFragment;
  bool hasVertex;
  bool isEnabled;
  bool hasShader;
  deUint32 curStageMask;
  int shaderStageNdx;
  size_t progNdx;
  deUint32 usedStageMask;
  bool isSeparable;
  deUint32 supportedStageMask;
  deUint32 tessCtrlEvalMask;
  deUint32 vtxFragMask;
  ShaderCaseSpecification *spec_local;
  
  bVar1 = std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::empty(&spec->programs);
  local_45 = 0;
  if (!bVar1) {
    pvVar7 = std::
             vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
             operator[](&spec->programs,0);
    local_45 = (pvVar7->sources).separable;
  }
  bVar1 = std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::empty(&spec->programs);
  if (bVar1) {
    tcu::print("ERROR: No programs specified!\n");
    return false;
  }
  if ((spec->fullGLSLES100Required & 1U) != 0) {
    if (spec->targetVersion != GLSL_VERSION_100_ES) {
      tcu::print("ERROR: Full GLSL ES 1.00 support requested for other GLSL version!\n");
      return false;
    }
    if (((spec->expectResult != EXPECT_PASS) && (spec->expectResult != EXPECT_VALIDATION_FAIL)) &&
       (spec->expectResult != EXPECT_BUILD_SUCCESSFUL)) {
      tcu::print(
                "ERROR: Full GLSL ES 1.00 support doesn\'t make sense when expecting compile/link failure!\n"
                );
      return false;
    }
  }
  bVar1 = de::inBounds<glu::sl::CaseType>(spec->caseType,CASETYPE_COMPLETE,CASETYPE_LAST);
  if (bVar1) {
    bVar1 = de::inBounds<glu::sl::ExpectResult>(spec->expectResult,EXPECT_PASS,EXPECT_LAST);
    if (bVar1) {
      bVar1 = isValid(&spec->values);
      if (bVar1) {
        bVar1 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty
                          (&(spec->values).inputs);
        if ((!bVar1) &&
           (bVar1 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty
                              (&(spec->values).outputs), !bVar1)) {
          pvVar8 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                             (&(spec->values).inputs,0);
          sVar9 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                  size(&pvVar8->elements);
          pvVar8 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                             (&(spec->values).inputs,0);
          iVar4 = VarType::getScalarSize(&pvVar8->type);
          pvVar8 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                             (&(spec->values).outputs,0);
          sVar10 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                   size(&pvVar8->elements);
          pvVar8 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                             (&(spec->values).outputs,0);
          iVar5 = VarType::getScalarSize(&pvVar8->type);
          if (sVar9 / (ulong)(long)iVar4 != sVar10 / (ulong)(long)iVar5) {
            tcu::print("ERROR: Number of input and output elements don\'t match!\n");
            return false;
          }
        }
        if ((local_45 & 1) == 0) {
          pvVar7 = std::
                   vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                   ::operator[](&spec->programs,0);
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)pvVar7);
          bVar2 = (bVar1 ^ 0xffU) & 1;
          pvVar7 = std::
                   vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                   ::operator[](&spec->programs,0);
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((pvVar7->sources).sources + 1);
          bVar3 = (bVar1 ^ 0xffU) & 1;
          sVar9 = std::
                  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                  ::size(&spec->programs);
          if (sVar9 != 1) {
            tcu::print("ERROR: Only cases using separable programs can have multiple programs!\n");
            return false;
          }
          if ((spec->caseType == CASETYPE_VERTEX_ONLY) && ((bVar2 == 0 || (bVar3 != 0)))) {
            tcu::print("ERROR: Vertex-only case must have only vertex shader!\n");
            return false;
          }
          if ((spec->caseType == CASETYPE_FRAGMENT_ONLY) && ((bVar2 != 0 || (bVar3 == 0)))) {
            tcu::print("ERROR: Fragment-only case must have only fragment shader!\n");
            return false;
          }
          if ((spec->caseType == CASETYPE_COMPLETE) && ((bVar2 == 0 || (bVar3 == 0)))) {
            tcu::print("ERROR: Complete case must have at least vertex and fragment shaders\n");
            return false;
          }
        }
        else {
          progNdx._4_4_ = 0;
          if (spec->caseType != CASETYPE_COMPLETE) {
            tcu::print("ERROR: Separable shaders supported only for complete cases!\n");
            return false;
          }
          for (_curStageMask = 0;
              sVar9 = std::
                      vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ::size(&spec->programs), _curStageMask < sVar9;
              _curStageMask = _curStageMask + 1) {
            for (_hasFragment = SHADERTYPE_VERTEX; (int)_hasFragment < 6;
                _hasFragment = _hasFragment + SHADERTYPE_FRAGMENT) {
              uVar6 = 1 << ((byte)_hasFragment & 0x1f);
              if ((uVar6 & 0x1f) == 0) {
                pvVar7 = std::
                         vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ::operator[](&spec->programs,_curStageMask);
                bVar1 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((pvVar7->sources).sources + (int)_hasFragment);
                if (!bVar1) {
                  pcVar11 = getShaderTypeName(_hasFragment);
                  tcu::print("ERROR: Source specified for unsupported shader stage %s!\n",pcVar11);
                  return false;
                }
              }
              else {
                pvVar7 = std::
                         vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ::operator[](&spec->programs,_curStageMask);
                bVar1 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((pvVar7->sources).sources + (int)_hasFragment);
                bVar1 = (bool)((bVar1 ^ 0xffU) & 1);
                pvVar7 = std::
                         vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ::operator[](&spec->programs,_curStageMask);
                bVar12 = (pvVar7->activeStages & uVar6) != 0;
                if (bVar1 != bVar12) {
                  pcVar11 = getShaderTypeName(_hasFragment);
                  tcu::print("ERROR: Inconsistent source/enable for shader stage %s!\n",pcVar11);
                  return false;
                }
                if ((bVar1 != false) && ((progNdx._4_4_ & uVar6) != 0)) {
                  pcVar11 = getShaderTypeName(_hasFragment);
                  tcu::print("ERROR: Stage %s enabled on multiple programs!\n",pcVar11);
                  return false;
                }
                if (bVar12) {
                  progNdx._4_4_ = uVar6 | progNdx._4_4_;
                }
              }
            }
          }
          if ((progNdx._4_4_ & 3) != 3) {
            tcu::print("ERROR: Vertex and fragment shaders are mandatory!\n");
            return false;
          }
          if (((progNdx._4_4_ & 0x18) != 0) && ((progNdx._4_4_ & 0x18) != 0x18)) {
            tcu::print(
                      "ERROR: Both tessellation control and eval shaders must be either enabled or disabled!\n"
                      );
            return false;
          }
        }
        spec_local._7_1_ = true;
      }
      else {
        spec_local._7_1_ = false;
      }
    }
    else {
      tcu::print("ERROR: Invalid expected result!\n");
      spec_local._7_1_ = false;
    }
  }
  else {
    tcu::print("ERROR: Invalid case type!\n");
    spec_local._7_1_ = false;
  }
  return spec_local._7_1_;
}

Assistant:

bool isValid (const ShaderCaseSpecification& spec)
{
	const deUint32	vtxFragMask			= (1u << SHADERTYPE_VERTEX)
										| (1u << SHADERTYPE_FRAGMENT);
	const deUint32	tessCtrlEvalMask	= (1u << SHADERTYPE_TESSELLATION_CONTROL)
										| (1u << SHADERTYPE_TESSELLATION_EVALUATION);
	const deUint32	supportedStageMask	= vtxFragMask | tessCtrlEvalMask
										| (1u << SHADERTYPE_GEOMETRY);
	const bool		isSeparable			= !spec.programs.empty() && spec.programs[0].sources.separable;

	if (spec.programs.empty())
	{
		print("ERROR: No programs specified!\n");
		return false;
	}

	if (spec.fullGLSLES100Required)
	{
		if (spec.targetVersion != GLSL_VERSION_100_ES)
		{
			print("ERROR: Full GLSL ES 1.00 support requested for other GLSL version!\n");
			return false;
		}

		if (spec.expectResult != EXPECT_PASS			&&
			spec.expectResult != EXPECT_VALIDATION_FAIL	&&
			spec.expectResult != EXPECT_BUILD_SUCCESSFUL)
		{
			print("ERROR: Full GLSL ES 1.00 support doesn't make sense when expecting compile/link failure!\n");
			return false;
		}
	}

	if (!de::inBounds(spec.caseType, (CaseType)0, CASETYPE_LAST))
	{
		print("ERROR: Invalid case type!\n");
		return false;
	}

	if (!de::inBounds(spec.expectResult, (ExpectResult)0, EXPECT_LAST))
	{
		print("ERROR: Invalid expected result!\n");
		return false;
	}

	if (!isValid(spec.values))
		return false;

	if (!spec.values.inputs.empty() && !spec.values.outputs.empty() &&
		spec.values.inputs[0].elements.size() / spec.values.inputs[0].type.getScalarSize() != spec.values.outputs[0].elements.size() / spec.values.outputs[0].type.getScalarSize())
	{
		print("ERROR: Number of input and output elements don't match!\n");
		return false;
	}

	if (isSeparable)
	{
		deUint32	usedStageMask	= 0u;

		if (spec.caseType != CASETYPE_COMPLETE)
		{
			print("ERROR: Separable shaders supported only for complete cases!\n");
			return false;
		}

		for (size_t progNdx = 0; progNdx < spec.programs.size(); ++progNdx)
		{
			for (int shaderStageNdx = 0; shaderStageNdx < SHADERTYPE_LAST; ++shaderStageNdx)
			{
				const deUint32	curStageMask	= (1u << shaderStageNdx);

				if (supportedStageMask & curStageMask)
				{
					const bool		hasShader	= !spec.programs[progNdx].sources.sources[shaderStageNdx].empty();
					const bool		isEnabled	= (spec.programs[progNdx].activeStages & curStageMask) != 0;

					if (hasShader != isEnabled)
					{
						print("ERROR: Inconsistent source/enable for shader stage %s!\n", getShaderTypeName((ShaderType)shaderStageNdx));
						return false;
					}

					if (hasShader && (usedStageMask & curStageMask) != 0)
					{
						print("ERROR: Stage %s enabled on multiple programs!\n", getShaderTypeName((ShaderType)shaderStageNdx));
						return false;
					}

					if (isEnabled)
						usedStageMask |= curStageMask;
				}
				else if (!spec.programs[progNdx].sources.sources[shaderStageNdx].empty())
				{
					print("ERROR: Source specified for unsupported shader stage %s!\n", getShaderTypeName((ShaderType)shaderStageNdx));
					return false;
				}
			}
		}

		if ((usedStageMask & vtxFragMask) != vtxFragMask)
		{
			print("ERROR: Vertex and fragment shaders are mandatory!\n");
			return false;
		}

		if ((usedStageMask & tessCtrlEvalMask) != 0 && (usedStageMask & tessCtrlEvalMask) != tessCtrlEvalMask)
		{
			print("ERROR: Both tessellation control and eval shaders must be either enabled or disabled!\n");
			return false;
		}
	}
	else
	{
		const bool	hasVertex		= !spec.programs[0].sources.sources[SHADERTYPE_VERTEX].empty();
		const bool	hasFragment		= !spec.programs[0].sources.sources[SHADERTYPE_FRAGMENT].empty();

		if (spec.programs.size() != 1)
		{
			print("ERROR: Only cases using separable programs can have multiple programs!\n");
			return false;
		}

		if (spec.caseType == CASETYPE_VERTEX_ONLY && (!hasVertex || hasFragment))
		{
			print("ERROR: Vertex-only case must have only vertex shader!\n");
			return false;
		}

		if (spec.caseType == CASETYPE_FRAGMENT_ONLY && (hasVertex || !hasFragment))
		{
			print("ERROR: Fragment-only case must have only fragment shader!\n");
			return false;
		}

		if (spec.caseType == CASETYPE_COMPLETE && (!hasVertex || !hasFragment))
		{
			print("ERROR: Complete case must have at least vertex and fragment shaders\n");
			return false;
		}
	}

	return true;
}